

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_maze.cpp
# Opt level: O3

int random_maze(vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *maze,int N)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  int j;
  ulong uVar4;
  int max1;
  uint uVar5;
  
  if (0 < N) {
    uVar2 = 0;
    do {
      uVar4 = 0;
      uVar5 = 0;
      do {
        if ((uint)N >> 1 < uVar5) {
          *(undefined4 *)
           (*(long *)&(maze->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar2].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           + uVar4 * 4) = 0;
          uVar3 = 0;
        }
        else {
          iVar1 = rand();
          *(int *)(*(long *)&(maze->
                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start[uVar2].
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data + uVar4 * 4) = iVar1 % 2;
          uVar3 = (uint)(iVar1 % 2 == 1);
        }
        uVar5 = uVar5 + uVar3;
        uVar4 = uVar4 + 1;
      } while ((uint)N != uVar4);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)N);
  }
  return 1;
}

Assistant:

int random_maze(vector<vector<int>> &maze, int N)
{
	try
	{

		for (int i = 0; i < N; i++)
		{
			int max1 = 0;
			for (int j = 0; j < N; j++)
			{
				if (max1 <= N / 2)
					maze[i][j] = rand() % 2;
				else
					maze[i][j] = 0;

				if (maze[i][j] == 1)
					max1++;
			}
		}
		return 1;
	}
	catch (const std::exception &)
	{
		cerr << "maze init error";
		return -1;
	}
}